

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O1

int __thiscall cmCTestScriptHandler::RunCurrentScript(cmCTestScriptHandler *this)

{
  double dVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  uint __seconds;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmList envArgs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  cmList local_38;
  
  this->ShouldRunCurrentScript = false;
  cmSystemTools::s_RunCommandHideConsole = true;
  iVar4 = ExtractVariables(this);
  if (iVar4 == 0) {
    sVar2 = (this->CTestEnv)._M_string_length;
    if (sVar2 != 0) {
      pcVar3 = (this->CTestEnv)._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_58,pcVar3,pcVar3 + sVar2);
      init._M_len = 1;
      init._M_array = &local_58;
      cmList::cmList(&local_38,init);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      cmSystemTools::AppendEnv(&local_38.Values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_38.Values);
    }
    if (0.0 <= this->ContinuousDuration) {
      UpdateElapsedTime(this);
      lVar5 = std::chrono::_V2::steady_clock::now();
      dVar1 = this->ContinuousDuration;
      if (this->EmptyBinDirOnce == true) {
        this->EmptyBinDir = true;
      }
      do {
        lVar6 = std::chrono::_V2::steady_clock::now();
        iVar4 = RunConfigurationDashboard(this);
        lVar7 = std::chrono::_V2::steady_clock::now();
        dVar8 = this->MinimumInterval * 1000000000.0;
        if ((double)(lVar7 - lVar6) < dVar8) {
          local_58._M_dataplus._M_p = (pointer)((dVar8 - (double)(lVar7 - lVar6)) / 1000000000.0);
          __seconds = cmDurationTo<unsigned_int>((cmDuration *)&local_58);
          sleep(__seconds);
        }
        if (this->EmptyBinDirOnce == true) {
          this->EmptyBinDir = false;
        }
        lVar6 = std::chrono::_V2::steady_clock::now();
      } while ((double)lVar6 < dVar1 * 1000000000.0 + (double)lVar5);
    }
    else {
      iVar4 = RunConfigurationDashboard(this);
    }
  }
  return iVar4;
}

Assistant:

int cmCTestScriptHandler::RunCurrentScript()
{
  int result;

  // do not run twice
  this->SetRunCurrentScript(false);

  // no popup widows
  cmSystemTools::SetRunCommandHideConsole(true);

  // extract the vars from the cache and store in ivars
  result = this->ExtractVariables();
  if (result) {
    return result;
  }

  // set any environment variables
  if (!this->CTestEnv.empty()) {
    cmList envArgs{ this->CTestEnv };
    cmSystemTools::AppendEnv(envArgs);
  }

  // now that we have done most of the error checking finally run the
  // dashboard, we may be asked to repeatedly run this dashboard, such as
  // for a continuous, do we need to run it more than once?
  if (this->ContinuousDuration >= 0) {
    this->UpdateElapsedTime();
    auto ending_time =
      std::chrono::steady_clock::now() + cmDuration(this->ContinuousDuration);
    if (this->EmptyBinDirOnce) {
      this->EmptyBinDir = true;
    }
    do {
      auto startOfInterval = std::chrono::steady_clock::now();
      result = this->RunConfigurationDashboard();
      auto interval = std::chrono::steady_clock::now() - startOfInterval;
      auto minimumInterval = cmDuration(this->MinimumInterval);
      if (interval < minimumInterval) {
        auto sleepTime =
          cmDurationTo<unsigned int>(minimumInterval - interval);
        this->SleepInSeconds(sleepTime);
      }
      if (this->EmptyBinDirOnce) {
        this->EmptyBinDir = false;
      }
    } while (std::chrono::steady_clock::now() < ending_time);
  }
  // otherwise just run it once
  else {
    result = this->RunConfigurationDashboard();
  }

  return result;
}